

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alias.cpp
# Opt level: O2

void duckdb::AliasFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  BoundFunctionExpression *pBVar1;
  const_reference this;
  pointer pEVar2;
  Value v;
  string local_70;
  Value local_50;
  
  pBVar1 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  if ((state->expr->super_BaseExpression).alias._M_string_length == 0) {
    this = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(&pBVar1->children,0);
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this);
    (*(pEVar2->super_BaseExpression)._vptr_BaseExpression[7])(&local_70,pEVar2);
  }
  else {
    ::std::__cxx11::string::string
              ((string *)&local_70,(string *)&(state->expr->super_BaseExpression).alias);
  }
  Value::Value(&local_50,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  Vector::Reference(result,&local_50);
  Value::~Value(&local_50);
  return;
}

Assistant:

static void AliasFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	Value v(state.expr.GetAlias().empty() ? func_expr.children[0]->GetName() : state.expr.GetAlias());
	result.Reference(v);
}